

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QGenericItemModel::sibling
          (QModelIndex *__return_storage_ptr__,QGenericItemModel *this,int row,int column,
          QModelIndex *index)

{
  long in_FS_OFFSET;
  int column_local;
  int row_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  column_local = column;
  row_local = row;
  QGenericItemModelImplBase::callConst<QModelIndex,int,int,QModelIndex>
            (__return_storage_ptr__,*(QGenericItemModelImplBase **)(this + 0x10),Sibling,&row_local,
             &column_local,index);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::sibling(int row, int column, const QModelIndex &index) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Sibling, row, column, index);
}